

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

size_t __thiscall Potassco::ProgramOptions::Option::maxColumn(Option *this)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *__s;
  size_t sVar4;
  Option *in_RDI;
  size_t argN;
  size_t col;
  undefined8 local_10;
  
  lVar3 = std::__cxx11::string::size();
  local_10 = lVar3 + 4;
  cVar1 = alias((Option *)0x2550af);
  if (cVar1 != '\0') {
    local_10 = lVar3 + 7;
  }
  __s = argName((Option *)0x2550cb);
  sVar4 = strlen(__s);
  if (sVar4 == 0) {
    value(in_RDI);
    bVar2 = Value::isNegatable((Value *)0x255153);
    if (bVar2) {
      local_10 = local_10 + 5;
    }
  }
  else {
    local_10 = sVar4 + 1 + local_10;
    value(in_RDI);
    bVar2 = Value::isImplicit((Value *)0x255105);
    if (bVar2) {
      local_10 = local_10 + 2;
    }
    value(in_RDI);
    bVar2 = Value::isNegatable((Value *)0x25512b);
    if (bVar2) {
      local_10 = local_10 + 3;
    }
  }
  return local_10;
}

Assistant:

std::size_t Option::maxColumn() const {
	std::size_t col = 4 + name_.size(); //  --name
	if (alias()) {
		col += 3; // ,-o
	}
	std::size_t argN = strlen(argName());
	if (argN) {
		col += (argN + 1); // =arg
		if (value()->isImplicit()) {
			col += 2; // []
		}
		if (value()->isNegatable()) {
			col += 3; // |no
		}
	}
	else if (value()->isNegatable()) {
		col += 5; // [no-]
	}
	return col;
}